

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20250127::debugging_internal::Demangle(char *mangled,char *out,size_t out_size)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  long lVar6;
  ReturnAddress RVar7;
  int iVar8;
  ulong uVar9;
  char cVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  State state;
  RustSymbolParser RStack_1e8;
  int iStack_34;
  
  if ((*mangled != '_') || (mangled[1] != 'R')) {
    RStack_1e8.out_end_ = (char *)0x218e0f;
    bVar4 = ParseMangledName((State *)&stack0xffffffffffffffd0);
    if ((bVar4) && (*mangled != '\0')) {
      lVar11 = 0;
      do {
        if (mangled[lVar11] != '.') {
          if (mangled[lVar11] == '\0') {
            return false;
          }
          break;
        }
        bVar5 = mangled[lVar11 + 1];
        bVar4 = (byte)((bVar5 & 0xdf) + 0xbf) < 0x1a;
        if (bVar5 == 0x5f || bVar4) {
          lVar11 = lVar11 + 1;
          do {
            do {
              bVar2 = mangled[lVar11 + 1];
              lVar11 = lVar11 + 1;
            } while (bVar2 == 0x5f);
          } while ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a);
          bVar3 = true;
          if (bVar2 == 0x2e) goto LAB_00218e9a;
        }
        else {
LAB_00218e9a:
          bVar3 = bVar5 == 0x5f || bVar4;
          if ((byte)(mangled[lVar11 + 1] - 0x30U) < 10) {
            lVar11 = lVar11 + 1;
            do {
              lVar6 = lVar11 + 1;
              lVar11 = lVar11 + 1;
            } while ((byte)(mangled[lVar6] - 0x30U) < 10);
            bVar3 = true;
          }
        }
      } while (bVar3);
      if (*mangled == '@') {
        RStack_1e8.out_end_ = (char *)0x218ee3;
        MaybeAppend((State *)&stack0xffffffffffffffd0,mangled);
      }
    }
    return false;
  }
  memset(&RStack_1e8,0,400);
  if (out_size != 0) {
    *out = '\0';
  }
  if (*mangled == '_') {
    iVar13 = 0;
    bVar5 = 0;
    if (mangled[1] == 'R') {
      RStack_1e8.recursion_depth_ = 1;
      RStack_1e8.recursion_stack_[0] = kInstantiatingCrate;
      RStack_1e8.encoding_ = mangled;
      RStack_1e8.out_ = out;
      RStack_1e8.out_end_ = out + out_size;
      iVar8 = 2;
LAB_0021cdbd:
      lVar11 = (long)iVar8 + 1;
      RStack_1e8.pos_ = (int)lVar11;
      cVar10 = RStack_1e8.encoding_[iVar8];
      if (cVar10 == 'B') {
        bVar4 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e8);
        if (!bVar4) goto LAB_0021db79;
        if (RStack_1e8.silence_depth_ != 0) goto switchD_0021d450_caseD_1c;
        lVar11 = (long)RStack_1e8.recursion_depth_;
        if (lVar11 == 0x100) goto LAB_0021db79;
        RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
        RStack_1e8.recursion_stack_[lVar11] = kPathBackrefEnding;
      }
      else {
        if (cVar10 == 'Y') {
          bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"<");
          if ((bVar4) && (lVar11 = (long)RStack_1e8.recursion_depth_, lVar11 != 0x100)) {
            RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
            RStack_1e8.recursion_stack_[lVar11] = kTraitDefinitionInfix;
            goto LAB_0021cf9c;
          }
          goto LAB_0021db79;
        }
        if (cVar10 == 'I') {
          lVar11 = (long)RStack_1e8.recursion_depth_;
          if (lVar11 == 0x100) goto LAB_0021db79;
          RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
          RStack_1e8.recursion_stack_[lVar11] = kBeginGenericArgList;
        }
        else {
          if (cVar10 == 'M') {
            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"<");
            bVar5 = 0;
            if (!bVar4) goto LAB_0021db7c;
            RVar7 = kInherentImplType;
          }
          else {
            if (cVar10 == 'N') {
              RStack_1e8.pos_ = iVar8 + 2;
              if (0x19 < (byte)(RStack_1e8.encoding_[lVar11] + 0xbfU)) {
                if (((byte)(RStack_1e8.encoding_[lVar11] + 0x9fU) < 0x1a) &&
                   (lVar11 = (long)RStack_1e8.recursion_depth_, lVar11 != 0x100)) {
                  RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                  RStack_1e8.recursion_stack_[lVar11] = kIdentifierInLowercaseNamespace;
                  goto switchD_0021cfd0_caseD_43;
                }
                goto LAB_0021db79;
              }
              lVar6 = (long)RStack_1e8.namespace_depth_;
              if (lVar6 == 0x40) goto LAB_0021db79;
              RStack_1e8.namespace_depth_ = RStack_1e8.namespace_depth_ + 1;
              RStack_1e8.namespace_stack_[lVar6] = RStack_1e8.encoding_[lVar11];
              lVar11 = (long)RStack_1e8.recursion_depth_;
              if (lVar11 == 0x100) goto LAB_0021db79;
              RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
              RStack_1e8.recursion_stack_[lVar11] = kIdentifierInUppercaseNamespace;
              goto switchD_0021cfd0_caseD_43;
            }
            if (cVar10 != 'X') {
              if (cVar10 == 'C') {
LAB_0021ce0e:
                bVar5 = 0;
                bVar4 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&RStack_1e8,'\0');
                if (bVar4) {
switchD_0021d450_default:
                  iVar8 = RStack_1e8.recursion_depth_;
                  if ((0x1fffe < iVar13) || (RStack_1e8.recursion_depth_ < 1)) goto LAB_0021db79;
                  iVar13 = iVar13 + 1;
                  uVar1 = RStack_1e8.recursion_depth_ - 1;
                  RStack_1e8.recursion_depth_ = uVar1;
                  switch(RStack_1e8.recursion_stack_[uVar1]) {
                  case kInstantiatingCrate:
                    if (0x19 < (byte)((RStack_1e8.encoding_[RStack_1e8.pos_] & 0xdfU) + 0xbf))
                    goto LAB_0021db59;
                    RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                    if (uVar1 == 0x100) goto LAB_0021db79;
                    RStack_1e8.recursion_depth_ = iVar8;
                    RStack_1e8.recursion_stack_[uVar1] = kVendorSpecificSuffix;
                    goto switchD_0021cfd0_caseD_43;
                  case kVendorSpecificSuffix:
LAB_0021db59:
                    if (0x2e < (byte)RStack_1e8.encoding_[RStack_1e8.pos_]) goto LAB_0021db79;
                    bVar5 = (byte)(0x401000000001 >> (RStack_1e8.encoding_[RStack_1e8.pos_] & 0x3fU)
                                  );
                    goto LAB_0021db7c;
                  case kIdentifierInUppercaseNamespace:
                    bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"::");
                    if (bVar4) {
                      lVar11 = (long)RStack_1e8.namespace_depth_;
                      RStack_1e8.namespace_depth_ = RStack_1e8.namespace_depth_ + -1;
                      bVar4 = anon_unknown_0::RustSymbolParser::ParseIdentifier
                                        (&RStack_1e8,RStack_1e8.namespace_stack_[lVar11 + -1]);
                      goto LAB_0021d80d;
                    }
                    goto LAB_0021db79;
                  case kIdentifierInLowercaseNamespace:
                    goto switchD_0021d450_caseD_3;
                  case kInherentImplType:
                    if (uVar1 != 0x100) {
                      RStack_1e8.recursion_depth_ = iVar8;
                      RStack_1e8.recursion_stack_[uVar1] = kInherentImplEnding;
                      goto LAB_0021cf9c;
                    }
                    goto LAB_0021db79;
                  case kInherentImplEnding:
                  case kTraitImplEnding:
                  case kTraitDefinitionEnding:
                    pcVar12 = ">";
                    break;
                  case kTraitImplType:
                    if (uVar1 != 0x100) {
                      RStack_1e8.recursion_depth_ = iVar8;
                      RStack_1e8.recursion_stack_[uVar1] = kTraitImplInfix;
                      goto LAB_0021cf9c;
                    }
                    goto LAB_0021db79;
                  case kTraitImplInfix:
                    bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8," as ");
                    if ((!bVar4) || (lVar11 = (long)RStack_1e8.recursion_depth_, lVar11 == 0x100))
                    goto LAB_0021db79;
                    RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                    RStack_1e8.recursion_stack_[lVar11] = kTraitImplEnding;
                    goto switchD_0021cfd0_caseD_43;
                  case kImplPathEnding:
                  case kFinishFn:
                    goto switchD_0021d450_caseD_9;
                  case kTraitDefinitionInfix:
                    bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8," as ");
                    if ((!bVar4) || (lVar11 = (long)RStack_1e8.recursion_depth_, lVar11 == 0x100))
                    goto LAB_0021db79;
                    RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                    RStack_1e8.recursion_stack_[lVar11] = kTraitDefinitionEnding;
                    goto switchD_0021cfd0_caseD_43;
                  case kArraySize:
                    bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"; ");
                    if ((bVar4) && (lVar11 = (long)RStack_1e8.recursion_depth_, lVar11 != 0x100)) {
                      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                      RStack_1e8.recursion_stack_[lVar11] = kFinishArray;
                      goto LAB_0021d871;
                    }
                    goto LAB_0021db79;
                  case kFinishArray:
                  case kSliceEnding:
                    pcVar12 = "]";
                    break;
                  case kAfterFirstTupleElement:
                    if (RStack_1e8.encoding_[RStack_1e8.pos_] != 'E') {
                      bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,", ");
                      if ((bVar4) && (lVar11 = (long)RStack_1e8.recursion_depth_, lVar11 != 0x100))
                      {
                        RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                        RStack_1e8.recursion_stack_[lVar11] = kAfterSecondTupleElement;
                        goto LAB_0021cf9c;
                      }
                      goto LAB_0021db79;
                    }
                    RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                    pcVar12 = ",)";
                    break;
                  case kAfterSecondTupleElement:
                    if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') goto LAB_0021d801;
                    bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,", ");
                    if ((bVar4) && (lVar11 = (long)RStack_1e8.recursion_depth_, lVar11 != 0x100)) {
                      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                      RStack_1e8.recursion_stack_[lVar11] = kAfterThirdTupleElement;
                      goto LAB_0021cf9c;
                    }
                    goto LAB_0021db79;
                  case kAfterThirdTupleElement:
                    if (RStack_1e8.encoding_[RStack_1e8.pos_] != 'E') {
                      bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,", ...)");
                      if (bVar4) {
                        RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                        goto switchD_0021d450_caseD_12;
                      }
                      goto LAB_0021db79;
                    }
LAB_0021d801:
                    RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                    pcVar12 = ")";
                    break;
                  case kAfterSubsequentTupleElement:
switchD_0021d450_caseD_12:
                    if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') goto LAB_0021d6ce;
                    lVar11 = (long)RStack_1e8.recursion_depth_;
                    if (lVar11 != 0x100) {
                      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                      RStack_1e8.recursion_stack_[lVar11] = kAfterSubsequentTupleElement;
                      goto LAB_0021cf9c;
                    }
                    goto LAB_0021db79;
                  case kContinueParameterList:
                    goto switchD_0021d450_caseD_13;
                  case kBeginAutoTraits:
                  case kContinueAutoTraits:
                    if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') {
LAB_0021d285:
                      lVar11 = (long)RStack_1e8.pos_;
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      if (RStack_1e8.encoding_[lVar11 + 1] == 'L') goto LAB_0021d861;
                      goto LAB_0021db79;
                    }
                    bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8," + ");
                    bVar5 = 0;
                    if ((!bVar4) ||
                       (RVar7 = kContinueAutoTraits, RStack_1e8.recursion_depth_ == 0x100))
                    goto LAB_0021db7c;
LAB_0021d355:
                    lVar11 = (long)RStack_1e8.recursion_depth_;
                    RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                    RStack_1e8.recursion_stack_[lVar11] = RVar7;
                    lVar11 = (long)RStack_1e8.recursion_depth_;
                    if (lVar11 == 0x100) goto LAB_0021db79;
                    RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                    RStack_1e8.recursion_stack_[lVar11] = kContinueDynTrait;
                    goto switchD_0021cfd0_caseD_43;
                  case kContinueDynTrait:
                    if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'p') {
                      bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"<>");
                      if (bVar4) {
                        RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                        goto switchD_0021d450_caseD_18;
                      }
                      goto LAB_0021db79;
                    }
                    goto switchD_0021d450_default;
                  case kContinueAssocBinding:
switchD_0021d450_caseD_18:
                    if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'p') {
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      bVar5 = 0;
                      bVar4 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                        (&RStack_1e8,'\0',0);
                      if (bVar4) {
                        lVar11 = (long)RStack_1e8.recursion_depth_;
                        if (lVar11 != 0x100) {
                          RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                          RStack_1e8.recursion_stack_[lVar11] = kContinueAssocBinding;
LAB_0021cf9c:
                          lVar11 = (long)RStack_1e8.pos_;
                          if ((byte)(RStack_1e8.encoding_[lVar11] + 0x9fU) < 0x1a)
                          goto LAB_0021d151;
                          switch(RStack_1e8.encoding_[lVar11]) {
                          case 'A':
                            RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"[");
                            bVar5 = 0;
                            if (!bVar4) goto LAB_0021db7c;
                            RVar7 = kArraySize;
                            break;
                          case 'B':
                            RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e8);
                            if (bVar4) {
                              if (RStack_1e8.silence_depth_ == 0) {
                                RVar7 = kTypeBackrefEnding;
                                goto LAB_0021d132;
                              }
                              goto switchD_0021d450_caseD_1c;
                            }
                            goto LAB_0021db79;
                          default:
                            goto switchD_0021cfd0_caseD_43;
                          case 'D':
                            RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"dyn ");
                            if ((!bVar4) ||
                               (bVar4 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder
                                                  (&RStack_1e8), !bVar4)) goto LAB_0021db79;
                            if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') goto LAB_0021d285;
                            RVar7 = kBeginAutoTraits;
                            if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_0021db79;
                            goto LAB_0021d355;
                          case 'F':
                            RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"fn...");
                            if (!bVar4) goto LAB_0021db79;
                            RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder
                                              (&RStack_1e8);
                            if (!bVar4) goto LAB_0021db79;
                            lVar11 = (long)RStack_1e8.pos_;
                            cVar10 = RStack_1e8.encoding_[lVar11];
                            if (cVar10 == 'U') {
                              RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                              cVar10 = RStack_1e8.encoding_[lVar11 + 1];
                            }
                            if (cVar10 == 'K') {
                              if (RStack_1e8.encoding_[(long)RStack_1e8.pos_ + 1] == 'C') {
                                RStack_1e8.pos_ = RStack_1e8.pos_ + 2;
                              }
                              else {
                                bVar5 = 0;
                                RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                                bVar4 = anon_unknown_0::RustSymbolParser::
                                        ParseUndisambiguatedIdentifier(&RStack_1e8,'\0',0);
                                if (!bVar4) goto LAB_0021db7c;
                              }
                            }
switchD_0021d450_caseD_13:
                            if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') {
                              RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                              lVar11 = (long)RStack_1e8.recursion_depth_;
                              if (lVar11 == 0x100) goto LAB_0021db79;
                              RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                              RStack_1e8.recursion_stack_[lVar11] = kFinishFn;
                            }
                            else {
                              lVar11 = (long)RStack_1e8.recursion_depth_;
                              if (lVar11 == 0x100) goto LAB_0021db79;
                              RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                              RStack_1e8.recursion_stack_[lVar11] = kContinueParameterList;
                            }
                            goto LAB_0021cf9c;
                          case 'O':
                            pcVar12 = "*mut ";
                            goto LAB_0021d0a2;
                          case 'P':
                            pcVar12 = "*const ";
LAB_0021d0a2:
                            RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,pcVar12);
LAB_0021d0a7:
                            bVar5 = 0;
                            if (bVar4 == false) goto LAB_0021db7c;
                            goto LAB_0021cf9c;
                          case 'Q':
                            pcVar12 = "&mut ";
                            goto LAB_0021d043;
                          case 'R':
                            pcVar12 = "&";
LAB_0021d043:
                            RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,pcVar12);
                            if (bVar4) {
                              bVar4 = anon_unknown_0::RustSymbolParser::ParseOptionalLifetime
                                                (&RStack_1e8);
                              goto LAB_0021d0a7;
                            }
                            goto LAB_0021db79;
                          case 'S':
                            RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"[");
                            bVar5 = 0;
                            if (!bVar4) goto LAB_0021db7c;
                            RVar7 = kSliceEnding;
                            break;
                          case 'T':
                            RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"(");
                            if (bVar4) {
                              if (RStack_1e8.encoding_[RStack_1e8.pos_] != 'E') {
                                RVar7 = kAfterFirstTupleElement;
LAB_0021d132:
                                if (RStack_1e8.recursion_depth_ != 0x100) goto LAB_0021d13d;
                                goto LAB_0021db79;
                              }
                              goto LAB_0021d801;
                            }
                            goto LAB_0021db79;
                          }
                          bVar5 = 0;
                          if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_0021db7c;
LAB_0021d13d:
                          lVar11 = (long)RStack_1e8.recursion_depth_;
                          RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                          RStack_1e8.recursion_stack_[lVar11] = RVar7;
                          goto LAB_0021cf9c;
                        }
                        goto LAB_0021db79;
                      }
                      goto LAB_0021db7c;
                    }
switchD_0021d450_caseD_9:
                    RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + -1;
                    goto switchD_0021d450_default;
                  case kConstData:
                    if ((RStack_1e8.encoding_[RStack_1e8.pos_] == 'n') &&
                       (RStack_1e8.pos_ = RStack_1e8.pos_ + 1, RStack_1e8.silence_depth_ < 2)) {
                      if ((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_ < 2) goto LAB_0021db79;
                      *RStack_1e8.out_ = '-';
                      RStack_1e8.out_[1] = '\0';
                      RStack_1e8.out_ = RStack_1e8.out_ + 1;
                    }
                    RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + -1;
                    bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"0x");
                    pcVar12 = RStack_1e8.out_;
                    if (!bVar4) goto LAB_0021db79;
                    uVar9 = (ulong)RStack_1e8.pos_;
                    cVar10 = RStack_1e8.encoding_[uVar9];
                    if (cVar10 == '0') {
                      if (RStack_1e8.silence_depth_ < 1) {
                        if ((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_ < 2)
                        goto LAB_0021db79;
                        RStack_1e8.out_ = RStack_1e8.out_ + 1;
                        *pcVar12 = '0';
                        *RStack_1e8.out_ = '\0';
                      }
                      if (RStack_1e8.encoding_[RStack_1e8.pos_ + 1] != '_') goto LAB_0021db79;
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 2;
                    }
                    else {
                      while (pcVar12 = RStack_1e8.out_, iVar8 = (int)uVar9,
                            (byte)(cVar10 - 0x30U) < 10 || (byte)(cVar10 + 0x9fU) < 6) {
                        if (RStack_1e8.silence_depth_ < 1) {
                          if ((long)RStack_1e8.out_end_ - (long)RStack_1e8.out_ < 2)
                          goto LAB_0021db79;
                          RStack_1e8.out_ = RStack_1e8.out_ + 1;
                          *pcVar12 = RStack_1e8.encoding_[iVar8];
                          *RStack_1e8.out_ = '\0';
                        }
                        uVar9 = (ulong)(iVar8 + 1U);
                        cVar10 = RStack_1e8.encoding_[(int)(iVar8 + 1U)];
                      }
                      if (cVar10 != '_') goto LAB_0021db79;
                      RStack_1e8.pos_ = iVar8 + 1;
                    }
                    goto switchD_0021d450_default;
                  case kBeginGenericArgList:
                    bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"::<>");
                    if (bVar4) {
                      RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                      goto switchD_0021d450_caseD_1b;
                    }
                    goto LAB_0021db79;
                  case kContinueGenericArgList:
switchD_0021d450_caseD_1b:
                    if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'E') {
LAB_0021d6ce:
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                      goto switchD_0021d450_caseD_9;
                    }
                    lVar11 = (long)RStack_1e8.recursion_depth_;
                    if (lVar11 != 0x100) {
                      RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                      RStack_1e8.recursion_stack_[lVar11] = kContinueGenericArgList;
                      if (RStack_1e8.encoding_[RStack_1e8.pos_] != 'K') {
                        if (RStack_1e8.encoding_[RStack_1e8.pos_] != 'L') goto LAB_0021cf9c;
LAB_0021d861:
                        bVar4 = anon_unknown_0::RustSymbolParser::ParseOptionalLifetime(&RStack_1e8)
                        ;
                        goto LAB_0021d80d;
                      }
                      RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
LAB_0021d871:
                      while (RStack_1e8.encoding_[RStack_1e8.pos_] == 'B') {
                        RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                        bVar4 = anon_unknown_0::RustSymbolParser::BeginBackref(&RStack_1e8);
                        if (!bVar4) goto LAB_0021db79;
                        if (RStack_1e8.silence_depth_ != 0) goto switchD_0021d450_caseD_1c;
                        lVar11 = (long)RStack_1e8.recursion_depth_;
                        if (lVar11 == 0x100) goto LAB_0021db79;
                        RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                        RStack_1e8.recursion_stack_[lVar11] = kConstantBackrefEnding;
                      }
                      if (RStack_1e8.encoding_[RStack_1e8.pos_] == 'p') {
                        RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
                        pcVar12 = "_";
                        break;
                      }
                      RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
                      lVar11 = (long)RStack_1e8.recursion_depth_;
                      if (lVar11 != 0x100) {
                        RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
                        RStack_1e8.recursion_stack_[lVar11] = kConstData;
                        goto LAB_0021cf9c;
                      }
                    }
                    goto LAB_0021db79;
                  case kPathBackrefEnding:
                  case kTypeBackrefEnding:
                  case kConstantBackrefEnding:
switchD_0021d450_caseD_1c:
                    lVar11 = (long)RStack_1e8.position_depth_;
                    RStack_1e8.position_depth_ = RStack_1e8.position_depth_ + -1;
                    RStack_1e8.pos_ = RStack_1e8.position_stack_[lVar11 + -1];
                  default:
                    goto switchD_0021d450_default;
                  }
                  goto LAB_0021d808;
                }
                goto LAB_0021db7c;
              }
              goto LAB_0021db79;
            }
            bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"<");
            bVar5 = 0;
            if (!bVar4) goto LAB_0021db7c;
            RVar7 = kTraitImplType;
          }
          bVar5 = 0;
          if (RStack_1e8.recursion_depth_ == 0x100) goto LAB_0021db7c;
          lVar11 = (long)RStack_1e8.recursion_depth_;
          RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
          RStack_1e8.recursion_stack_[lVar11] = RVar7;
          RStack_1e8.silence_depth_ = RStack_1e8.silence_depth_ + 1;
          bVar4 = anon_unknown_0::RustSymbolParser::ParseDisambiguator(&RStack_1e8,&iStack_34);
          if ((!bVar4) || (lVar11 = (long)RStack_1e8.recursion_depth_, lVar11 == 0x100))
          goto LAB_0021db79;
          RStack_1e8.recursion_depth_ = RStack_1e8.recursion_depth_ + 1;
          RStack_1e8.recursion_stack_[lVar11] = kImplPathEnding;
        }
      }
switchD_0021cfd0_caseD_43:
      iVar8 = RStack_1e8.pos_;
      goto LAB_0021cdbd;
    }
  }
  else {
LAB_0021db79:
    bVar5 = 0;
  }
LAB_0021db7c:
  return (bool)(bVar5 & 1);
LAB_0021d151:
  RStack_1e8.pos_ = RStack_1e8.pos_ + 1;
  bVar5 = RStack_1e8.encoding_[lVar11] + 0x9f;
  if ((0x19 < bVar5) || ((0x3bcfbbfU >> (bVar5 & 0x1f) & 1) == 0)) goto LAB_0021db79;
  pcVar12 = &DAT_00285ff4 + *(int *)(&DAT_00285ff4 + (ulong)bVar5 * 4);
LAB_0021d808:
  bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,pcVar12);
LAB_0021d80d:
  if (bVar4 == false) goto LAB_0021db79;
  goto switchD_0021d450_default;
switchD_0021d450_caseD_3:
  bVar4 = anon_unknown_0::RustSymbolParser::Emit(&RStack_1e8,"::");
  if (!bVar4) goto LAB_0021db79;
  goto LAB_0021ce0e;
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
  if (mangled[0] == '_' && mangled[1] == 'R') {
    return DemangleRustSymbolEncoding(mangled, out, out_size);
  }

  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !Overflowed(&state) &&
         state.parse_state.out_cur_idx > 0;
}